

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_div_m68k(floatx80 a,floatx80 b,float_status *status)

{
  uint16_t uVar1;
  _Bool _Var2;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 fVar3;
  floatx80 fVar4;
  uint64_t local_a0;
  uint64_t term2;
  uint64_t term1;
  uint64_t term0;
  uint64_t rem2;
  uint64_t rem1;
  uint64_t rem0;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig;
  uint64_t aSig;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag bSign;
  flag aSign;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  uint16_t local_10;
  
  status_local = (float_status *)b.low;
  b_local._8_8_ = a.low;
  b_local.low._0_2_ = b.high;
  uVar1 = a.high;
  fVar3._10_6_ = 0;
  fVar3.low = (long)a._0_10_;
  fVar3.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var2 = floatx80_invalid_encoding(fVar3);
  if ((_Var2) ||
     (a_00.high = (uint16_t)b_local.low, a_00.low = (uint64_t)status_local, a_00._10_6_ = 0,
     _Var2 = floatx80_invalid_encoding(a_00), _Var2)) {
    float_raise_m68k('\x01',_aExp);
    fVar3 = floatx80_default_nan_m68k(_aExp);
    local_10 = fVar3.high;
    goto LAB_00869e20;
  }
  a_01.high = uVar1;
  a_01.low = b_local._8_8_;
  a_01._10_6_ = 0;
  bSig = extractFloatx80Frac(a_01);
  a_02.high = uVar1;
  a_02.low = b_local._8_8_;
  a_02._10_6_ = 0;
  zExp = extractFloatx80Exp(a_02);
  a_03.high = uVar1;
  a_03.low = b_local._8_8_;
  a_03._10_6_ = 0;
  bExp._3_1_ = extractFloatx80Sign(a_03);
  a_04.high = (uint16_t)b_local.low;
  a_04.low = (uint64_t)status_local;
  a_04._10_6_ = 0;
  zSig0 = extractFloatx80Frac(a_04);
  a_05.high = (uint16_t)b_local.low;
  a_05.low = (uint64_t)status_local;
  a_05._10_6_ = 0;
  aSig._4_4_ = extractFloatx80Exp(a_05);
  a_06.high = (uint16_t)b_local.low;
  a_06.low = (uint64_t)status_local;
  a_06._10_6_ = 0;
  bExp._2_1_ = extractFloatx80Sign(a_06);
  bExp._1_1_ = bExp._3_1_ ^ bExp._2_1_;
  if (zExp == 0x7fff) {
    if ((bSig & 0x7fffffffffffffff) != 0) {
      a_07.high = uVar1;
      a_07.low = b_local._8_8_;
      b_00.high = (uint16_t)b_local.low;
      b_00.low = (uint64_t)status_local;
      a_07._10_6_ = 0;
      b_00._10_6_ = 0;
      fVar3 = propagateFloatx80NaN_m68k(a_07,b_00,_aExp);
      local_10 = fVar3.high;
      goto LAB_00869e20;
    }
    if (aSig._4_4_ != 0x7fff) {
      fVar3 = packFloatx80(bExp._1_1_,0x7fff,0);
      local_10 = fVar3.high;
      goto LAB_00869e20;
    }
    if ((zSig0 & 0x7fffffffffffffff) != 0) {
      a_08.high = uVar1;
      a_08.low = b_local._8_8_;
      b_01.high = (uint16_t)b_local.low;
      b_01.low = (uint64_t)status_local;
      a_08._10_6_ = 0;
      b_01._10_6_ = 0;
      fVar3 = propagateFloatx80NaN_m68k(a_08,b_01,_aExp);
      local_10 = fVar3.high;
      goto LAB_00869e20;
    }
LAB_00869bda:
    float_raise_m68k('\x01',_aExp);
    fVar3 = floatx80_default_nan_m68k(_aExp);
    local_10 = fVar3.high;
  }
  else {
    if (aSig._4_4_ == 0x7fff) {
      if ((zSig0 & 0x7fffffffffffffff) == 0) {
        fVar3 = packFloatx80(bExp._1_1_,0,0);
        local_10 = fVar3.high;
      }
      else {
        a_09.high = uVar1;
        a_09.low = b_local._8_8_;
        b_02.high = (uint16_t)b_local.low;
        b_02.low = (uint64_t)status_local;
        a_09._10_6_ = 0;
        b_02._10_6_ = 0;
        fVar3 = propagateFloatx80NaN_m68k(a_09,b_02,_aExp);
        local_10 = fVar3.high;
      }
      goto LAB_00869e20;
    }
    if (aSig._4_4_ == 0) {
      if (zSig0 == 0) {
        if (zExp != 0 || bSig != 0) {
          float_raise_m68k('\x04',_aExp);
          fVar3 = packFloatx80(bExp._1_1_,0x7fff,0);
          local_10 = fVar3.high;
          goto LAB_00869e20;
        }
        goto LAB_00869bda;
      }
      normalizeFloatx80Subnormal_m68k(zSig0,(int32_t *)((long)&aSig + 4),&zSig0);
    }
    if (zExp == 0) {
      if (bSig == 0) {
        fVar3 = packFloatx80(bExp._1_1_,0,0);
        local_10 = fVar3.high;
        goto LAB_00869e20;
      }
      normalizeFloatx80Subnormal_m68k(bSig,&zExp,&bSig);
    }
    aSig._0_4_ = (zExp - aSig._4_4_) + 0x3ffe;
    rem2 = 0;
    if (zSig0 <= bSig) {
      shift128Right(bSig,0,1,&bSig,&rem2);
      aSig._0_4_ = (int)aSig + 1;
    }
    zSig1 = estimateDiv128To64(bSig,rem2,zSig0);
    mul64To128(zSig0,zSig1,&term1,&term2);
    sub128(bSig,rem2,term1,term2,&rem1,&rem2);
    while ((long)rem1 < 0) {
      zSig1 = zSig1 - 1;
      add128(rem1,rem2,0,zSig0,&rem1,&rem2);
    }
    rem0 = estimateDiv128To64(rem2,0,zSig0);
    if (rem0 * 2 < 9) {
      mul64To128(zSig0,rem0,&term2,&local_a0);
      sub128(rem2,0,term2,local_a0,&rem2,&term0);
      while ((long)rem2 < 0) {
        rem0 = rem0 - 1;
        add128(rem2,term0,0,zSig0,&rem2,&term0);
      }
      rem0 = (long)(int)(uint)(rem2 != 0 || term0 != 0) | rem0;
    }
    fVar3 = roundAndPackFloatx80_m68k
                      (_aExp->floatx80_rounding_precision,bExp._1_1_,(int)aSig,zSig1,rem0,_aExp);
    local_10 = fVar3.high;
  }
LAB_00869e20:
  a_local._8_8_ = fVar3.low;
  fVar4._10_6_ = fVar3._10_6_;
  fVar4.high = local_10;
  fVar4.low = a_local._8_8_;
  return fVar4;
}

Assistant:

floatx80 floatx80_div(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    uint64_t rem0, rem1, rem2, term0, term1, term2;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80( zSign, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            if ( ( aExp | aSig ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return floatx80_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(zSign, floatx80_infinity_high,
                                       floatx80_infinity_low);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    zExp = aExp - bExp + 0x3FFE;
    rem1 = 0;
    if ( bSig <= aSig ) {
        shift128Right( aSig, 0, 1, &aSig, &rem1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig, rem1, bSig );
    mul64To128( bSig, zSig0, &term0, &term1 );
    sub128( aSig, rem1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add128( rem0, rem1, 0, bSig, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, bSig );
    if ( (uint64_t) ( zSig1<<1 ) <= 8 ) {
        mul64To128( bSig, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add128( rem1, rem2, 0, bSig, &rem1, &rem2 );
        }
        zSig1 |= ( ( rem1 | rem2 ) != 0 );
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}